

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O3

CommandOptions * show_file_info(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FILE *pFVar6;
  int iVar7;
  undefined4 extraout_var;
  Dictionary *pDVar9;
  long *plVar10;
  IFileReaderFactory *in_RDX;
  char *__s;
  EssenceType_t EssenceType;
  FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> wrapper;
  allocator<char> local_395;
  undefined1 local_394 [4];
  undefined1 local_390 [104];
  v2f *local_328 [2];
  v2f local_318 [2];
  undefined1 local_308 [16];
  channel local_2f8 [8];
  double local_168;
  double local_160;
  double local_50;
  double local_48;
  long *plVar8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_308,(char *)fileReaderFactory[1]._vptr_IFileReaderFactory[2],
             (allocator<char> *)local_390);
  ASDCP::EssenceType((string *)Options,(EssenceType_t *)local_308,(IFileReaderFactory *)local_394);
  if ((channel *)local_308._0_8_ != local_2f8) {
    operator_delete((void *)local_308._0_8_,(ulong)(local_2f8[0].name._M_dataplus._M_p + 1));
  }
  iVar7._0_1_ = Options->error_flag;
  iVar7._1_1_ = Options->version_flag;
  iVar7._2_1_ = Options->help_flag;
  iVar7._3_1_ = Options->verbose_flag;
  if (iVar7 < 0) {
    return Options;
  }
  if (local_394 == (undefined1  [4])0xe) {
    FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor>::FileInfoWrapper
              ((FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *)local_308,in_RDX)
    ;
    FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor>::file_info
              ((FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *)local_390,
               (CommandOptions *)local_308,(char *)fileReaderFactory,(FILE *)"ACES pictures");
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_390);
    Kumu::Result_t::~Result_t((Result_t *)local_390);
    iVar2._0_1_ = Options->error_flag;
    iVar2._1_1_ = Options->version_flag;
    iVar2._2_1_ = Options->help_flag;
    iVar2._3_1_ = Options->verbose_flag;
    if (-1 < iVar2) {
      FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor>::get_PictureEssenceCoding
                ((FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *)local_308,
                 (FILE *)0x0);
      FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor>::calc_Bitrate
                ((FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *)local_308,
                 (FILE *)_stdout);
      if (*(char *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 4) == '\x01') {
        FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor>::dump_PictureEssenceCoding
                  ((FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *)local_308,
                   (FILE *)_stdout);
      }
      pFVar6 = _stdout;
      if (*(char *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 5) == '\x01') {
        fprintf(_stdout,"Max BitRate: %0.2f Mb/s\n",local_168);
        fprintf(pFVar6,"Average BitRate: %0.2f Mb/s\n",local_160);
      }
      FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor>::test_rates
                ((FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *)local_390,
                 (CommandOptions *)local_308,(FILE *)fileReaderFactory);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_390);
      Kumu::Result_t::~Result_t((Result_t *)local_390);
    }
    FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor>::~FileInfoWrapper
              ((FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *)local_308);
    return Options;
  }
  if (local_394 == (undefined1  [4])0x9) {
    FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::FileInfoWrapper
              ((FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *)local_308,in_RDX);
    FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::file_info
              ((FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *)local_390,
               (CommandOptions *)local_308,(char *)fileReaderFactory,(FILE *)"JPEG 2000 pictures");
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_390);
    Kumu::Result_t::~Result_t((Result_t *)local_390);
    iVar1._0_1_ = Options->error_flag;
    iVar1._1_1_ = Options->version_flag;
    iVar1._2_1_ = Options->help_flag;
    iVar1._3_1_ = Options->verbose_flag;
    if (-1 < iVar1) {
      FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::get_PictureEssenceCoding
                ((FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *)local_308,
                 (FILE *)0x0);
      FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::calc_Bitrate
                ((FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *)local_308,
                 (FILE *)_stdout);
      if (*(char *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 4) == '\x01') {
        FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::dump_PictureEssenceCoding
                  ((FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *)local_308,
                   (FILE *)_stdout);
      }
      pFVar6 = _stdout;
      if (*(char *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 5) == '\x01') {
        fprintf(_stdout,"Max BitRate: %0.2f Mb/s\n",local_50);
        fprintf(pFVar6,"Average BitRate: %0.2f Mb/s\n",local_48);
      }
      FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::test_rates
                ((FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *)local_390,
                 (CommandOptions *)local_308,(FILE *)fileReaderFactory);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_390);
      Kumu::Result_t::~Result_t((Result_t *)local_390);
    }
    FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::~FileInfoWrapper
              ((FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *)local_308);
    return Options;
  }
  if (((uint)local_394 & 0xfffffffe) == 10) {
    FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor>::FileInfoWrapper
              ((FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor> *)local_308,in_RDX);
    FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor>::file_info
              ((FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor> *)local_390,
               (CommandOptions *)local_308,(char *)fileReaderFactory,(FILE *)"PCM audio");
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_390);
    Kumu::Result_t::~Result_t((Result_t *)local_390);
    iVar3._0_1_ = Options->error_flag;
    iVar3._1_1_ = Options->version_flag;
    iVar3._2_1_ = Options->help_flag;
    iVar3._3_1_ = Options->verbose_flag;
    if ((-1 < iVar3) &&
       (*(char *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 4) == '\x01')) {
      FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor>::dump_WaveAudioDescriptor
                ((FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor> *)local_308,
                 (FILE *)_stdout);
    }
    FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor>::~FileInfoWrapper
              ((FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor> *)local_308);
    return Options;
  }
  if (local_394 == (undefined1  [4])0xf) {
    FileInfoWrapper<AS_02::IAB::MXFReader,_MyIabDescriptor>::FileInfoWrapper
              ((FileInfoWrapper<AS_02::IAB::MXFReader,_MyIabDescriptor> *)local_308,in_RDX);
    FileInfoWrapper<AS_02::IAB::MXFReader,_MyIabDescriptor>::file_info
              ((FileInfoWrapper<AS_02::IAB::MXFReader,_MyIabDescriptor> *)local_390,
               (CommandOptions *)local_308,(char *)fileReaderFactory,(FILE *)"IAB audio");
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_390);
    Kumu::Result_t::~Result_t((Result_t *)local_390);
    FileInfoWrapper<AS_02::IAB::MXFReader,_MyIabDescriptor>::~FileInfoWrapper
              ((FileInfoWrapper<AS_02::IAB::MXFReader,_MyIabDescriptor> *)local_308);
    return Options;
  }
  if (local_394 == (undefined1  [4])0x10) {
    FileInfoWrapper<AS_02::JXS::MXFReader,_MyJXSDescriptor>::FileInfoWrapper
              ((FileInfoWrapper<AS_02::JXS::MXFReader,_MyJXSDescriptor> *)local_308,in_RDX);
    FileInfoWrapper<AS_02::JXS::MXFReader,_MyJXSDescriptor>::file_info
              ((FileInfoWrapper<AS_02::JXS::MXFReader,_MyJXSDescriptor> *)local_390,
               (CommandOptions *)local_308,(char *)fileReaderFactory,(FILE *)"JPEG XS");
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_390);
    Kumu::Result_t::~Result_t((Result_t *)local_390);
    FileInfoWrapper<AS_02::JXS::MXFReader,_MyJXSDescriptor>::~FileInfoWrapper
              ((FileInfoWrapper<AS_02::JXS::MXFReader,_MyJXSDescriptor> *)local_308);
    return Options;
  }
  fprintf(_stderr,"Unknown/unsupported essence type: %s\n",
          fileReaderFactory[1]._vptr_IFileReaderFactory[2]);
  iVar7 = (**in_RDX->_vptr_IFileReaderFactory)();
  plVar8 = (long *)CONCAT44(extraout_var,iVar7);
  pDVar9 = (Dictionary *)ASDCP::DefaultCompositeDict();
  ASDCP::MXF::OP1aHeader::OP1aHeader((OP1aHeader *)local_308,pDVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_328,(char *)fileReaderFactory[1]._vptr_IFileReaderFactory[2],&local_395
            );
  (**(code **)(*plVar8 + 0x10))(local_390,plVar8,local_328);
  Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_390);
  Kumu::Result_t::~Result_t((Result_t *)local_390);
  if (local_328[0] != local_318) {
    operator_delete(local_328[0],(long)local_318[0] + 1);
  }
  iVar4._0_1_ = Options->error_flag;
  iVar4._1_1_ = Options->version_flag;
  iVar4._2_1_ = Options->help_flag;
  iVar4._3_1_ = Options->verbose_flag;
  if (iVar4 < 0) {
LAB_0010ad3c:
    __s = "File is not MXF.\n";
  }
  else {
    ASDCP::MXF::OP1aHeader::InitFromFile((IFileReader *)local_390);
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_390);
    Kumu::Result_t::~Result_t((Result_t *)local_390);
    iVar5._0_1_ = Options->error_flag;
    iVar5._1_1_ = Options->version_flag;
    iVar5._2_1_ = Options->help_flag;
    iVar5._3_1_ = Options->verbose_flag;
    if (iVar5 < 0) goto LAB_0010ad3c;
    ASDCP::MXF::Partition::Dump((_IO_FILE *)local_308);
    plVar10 = (long *)ASDCP::MXF::OP1aHeader::GetIdentification();
    if (plVar10 == (long *)0x0) {
      fputs("File contains no Identification object.\n",_stdout);
    }
    else {
      (**(code **)(*plVar10 + 0x88))(plVar10);
    }
    plVar10 = (long *)ASDCP::MXF::OP1aHeader::GetSourcePackage();
    if (plVar10 != (long *)0x0) {
      (**(code **)(*plVar10 + 0x88))(plVar10);
      goto LAB_0010ad81;
    }
    __s = "File contains no SourcePackage object.\n";
  }
  fputs(__s,_stdout);
LAB_0010ad81:
  ASDCP::MXF::OP1aHeader::~OP1aHeader((OP1aHeader *)local_308);
  (**(code **)(*plVar8 + 8))(plVar8);
  return Options;
}

Assistant:

Result_t
show_file_info(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  EssenceType_t EssenceType;
  Result_t result = ASDCP::EssenceType(Options.filenames.front().c_str(), EssenceType, fileReaderFactory);

  if ( ASDCP_FAILURE(result) )
    return result;

  if ( EssenceType == ESS_AS02_JPEG_2000 )
    {
	  FileInfoWrapper<AS_02::JP2K::MXFReader, MyPictureDescriptor> wrapper(fileReaderFactory);
	  result = wrapper.file_info(Options, "JPEG 2000 pictures");

	  if ( KM_SUCCESS(result) )
	    {
	      wrapper.get_PictureEssenceCoding();
	      wrapper.calc_Bitrate(stdout);

	      if ( Options.showcoding_flag )
		{
		  wrapper.dump_PictureEssenceCoding(stdout);
		}

	      if ( Options.showrate_flag )
		{
		  wrapper.dump_Bitrate(stdout);
		}

	      result = wrapper.test_rates(Options, stdout);
	    }
    }

  else if ( EssenceType == ESS_AS02_ACES )
    {
	  FileInfoWrapper<AS_02::ACES::MXFReader, MyACESPictureDescriptor> wrapper(fileReaderFactory);
	  result = wrapper.file_info(Options, "ACES pictures");

	  if ( KM_SUCCESS(result) )
	    {
	      wrapper.get_PictureEssenceCoding();
	      wrapper.calc_Bitrate(stdout);

	      if ( Options.showcoding_flag )
		{
		  wrapper.dump_PictureEssenceCoding(stdout);
		}

	      if ( Options.showrate_flag )
		{
		  wrapper.dump_Bitrate(stdout);
		}

	      result = wrapper.test_rates(Options, stdout);
	    }
    }

  else if ( EssenceType == ESS_AS02_PCM_24b_48k || EssenceType == ESS_AS02_PCM_24b_96k )
    {
      FileInfoWrapper<AS_02::PCM::MXFReader, MyAudioDescriptor> wrapper(fileReaderFactory);
      result = wrapper.file_info(Options, "PCM audio");

      if ( ASDCP_SUCCESS(result) && Options.showcoding_flag )
	wrapper.dump_WaveAudioDescriptor(stdout);
    }
  else if ( EssenceType == ESS_AS02_JPEG_XS )
    {
      FileInfoWrapper<AS_02::JXS::MXFReader, MyJXSDescriptor> wrapper(fileReaderFactory);
      result = wrapper.file_info(Options, "JPEG XS");
    }
  else if ( EssenceType == ESS_AS02_IAB )
    {
      FileInfoWrapper<AS_02::IAB::MXFReader, MyIabDescriptor> wrapper(fileReaderFactory);
      result = wrapper.file_info(Options, "IAB audio");
    }
  else
    {
      fprintf(stderr, "Unknown/unsupported essence type: %s\n", Options.filenames.front().c_str());
      ASDCP::mem_ptr<Kumu::IFileReader> Reader(fileReaderFactory.CreateFileReader());
      const Dictionary* Dict = &DefaultCompositeDict();
      MXF::OP1aHeader TestHeader(Dict);

      result = Reader->OpenRead(Options.filenames.front().c_str());

      if ( ASDCP_SUCCESS(result) )
	    result = TestHeader.InitFromFile(*Reader); // test UL and OP

      if ( ASDCP_SUCCESS(result) )
	{
	  TestHeader.Partition::Dump(stdout);

	  if ( MXF::Identification* ID = TestHeader.GetIdentification() )
	    ID->Dump(stdout);
	  else
	    fputs("File contains no Identification object.\n", stdout);

	  if ( MXF::SourcePackage* SP = TestHeader.GetSourcePackage() )
	    SP->Dump(stdout);
	  else
	    fputs("File contains no SourcePackage object.\n", stdout);
	}
      else
	{
	  fputs("File is not MXF.\n", stdout);
	}
    }  
  return result;
}